

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

int64_t duckdb::StringSliceOperations::ValueLength(string_t *value)

{
  int64_t iVar1;
  idx_t i;
  ulong uVar2;
  
  iVar1 = 0;
  for (uVar2 = 0; (*(ulong *)&value->value & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

static int64_t ValueLength(const string_t &value) {
		return Length<string_t, int64_t>(value);
	}